

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_collect_disconnect_stats(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_68 [8];
  char s [80];
  wchar_t stop_on_disconnect;
  wchar_t nsim;
  command_conflict *cmd_local;
  
  _Var1 = stats_are_enabled();
  if (_Var1) {
    wVar2 = cmd_get_arg_number((command *)cmd,"quantity",(int *)(s + 0x4c));
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_disconnect_stats::default_nsim);
      _Var1 = get_string("Number of simulations: ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,(int *)(s + 0x4c));
      if (!_Var1) {
        return;
      }
      if ((int)s._76_4_ < 1) {
        return;
      }
      cmd_set_arg_number((command *)cmd,"quantity",s._76_4_);
    }
    do_cmd_wiz_collect_disconnect_stats::default_nsim._0_1_ = s[0x4c];
    do_cmd_wiz_collect_disconnect_stats::default_nsim._1_1_ = s[0x4d];
    do_cmd_wiz_collect_disconnect_stats::default_nsim._2_1_ = s[0x4e];
    do_cmd_wiz_collect_disconnect_stats::default_nsim._3_1_ = s[0x4f];
    wVar2 = cmd_get_arg_choice((command *)cmd,"choice",(int *)(s + 0x48));
    if (wVar2 != L'\0') {
      _Var1 = get_check("Stop if disconnected level found? ");
      s._72_4_ = ZEXT14(_Var1);
      cmd_set_arg_choice((command *)cmd,"choice",s._72_4_);
    }
    disconnect_stats(s._76_4_,s._72_4_ != 0);
  }
  return;
}

Assistant:

void do_cmd_wiz_collect_disconnect_stats(struct command *cmd)
{
	/* Record last-used value to be the default in next run. */
	static int default_nsim = 50;
	int nsim, stop_on_disconnect;

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		char s[80];

		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_nsim);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}
	default_nsim = nsim;

	if (cmd_get_arg_choice(cmd, "choice", &stop_on_disconnect) != CMD_OK) {
		stop_on_disconnect =
			get_check("Stop if disconnected level found? ") ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", stop_on_disconnect);
	}

	disconnect_stats(nsim, stop_on_disconnect != 0);
}